

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  char **ppcVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  sqlite3 *db;
  Table *pTVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  char **data;
  char **ppcVar10;
  uint uVar11;
  RenameToken *pRVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  u64 n;
  char *pcVar17;
  char *pcVar18;
  
  db = pParse->db;
  pTVar6 = pParse->pNewTable;
  if ((pTVar6 != (Table *)0x0) && (pParse->eParseMode != '\x01')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar6->nCol) {
        uVar11 = 1;
        if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == 1)) goto LAB_00174e18;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar6->aCol[(ushort)pTVar6->nCol - 1].zCnName,pTo);
      }
    }
    else if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == pFromCol->nExpr)) {
      uVar11 = pFromCol->nExpr;
LAB_00174e18:
      n = (long)(int)uVar11 * 0x10 + (ulong)pTo->n + 0x41;
      if ((pToCol != (ExprList *)0x0) && (iVar5 = pToCol->nExpr, 0 < (long)iVar5)) {
        lVar14 = 0;
        do {
          pcVar17 = *(char **)((long)&pToCol->a[0].zEName + lVar14);
          if (pcVar17 == (char *)0x0) {
            lVar9 = 1;
          }
          else {
            sVar8 = strlen(pcVar17);
            lVar9 = (ulong)((uint)sVar8 & 0x3fffffff) + 1;
          }
          n = n + lVar9;
          lVar14 = lVar14 + 0x18;
        } while ((long)iVar5 * 0x18 != lVar14);
      }
      data = (char **)sqlite3DbMallocZero(db,n);
      if (data == (char **)0x0) {
        data = (char **)0x0;
        goto LAB_00174dad;
      }
      *data = (char *)pTVar6;
      data[1] = (char *)(pTVar6->u).tab.pFKey;
      ppcVar10 = data + (long)(int)uVar11 * 2 + 8;
      data[2] = (char *)ppcVar10;
      if (1 < pParse->eParseMode) {
        sqlite3RenameTokenMap(pParse,ppcVar10,pTo);
      }
      ppcVar1 = data + 8;
      memcpy(ppcVar10,pTo->z,(ulong)pTo->n);
      *(undefined1 *)((long)ppcVar10 + (ulong)pTo->n) = 0;
      sqlite3Dequote((char *)ppcVar10);
      uVar7 = pTo->n;
      *(uint *)(data + 5) = uVar11;
      if (pFromCol == (ExprList *)0x0) {
        *(int *)ppcVar1 = pTVar6->nCol + -1;
      }
      else if (0 < (int)uVar11) {
        sVar4 = pTVar6->nCol;
        lVar14 = (long)sVar4;
        uVar15 = 0;
LAB_00174f66:
        if (0 < sVar4) {
          lVar9 = 0;
          bVar13 = 0 < lVar14;
LAB_00174f93:
          lVar16 = 0;
          do {
            bVar2 = pTVar6->aCol[lVar9].zCnName[lVar16];
            bVar3 = pFromCol->a[uVar15].zEName[lVar16];
            if (bVar2 == bVar3) {
              if ((ulong)bVar2 == 0) goto LAB_00174fc6;
            }
            else if (""[bVar2] != ""[bVar3]) goto LAB_00174fc6;
            lVar16 = lVar16 + 1;
          } while( true );
        }
        goto LAB_001750c0;
      }
LAB_00175103:
      if (0 < (int)uVar11 && pToCol != (ExprList *)0x0) {
        pcVar17 = (char *)((long)ppcVar10 + (ulong)(uVar7 + 1));
        uVar15 = 0;
        do {
          pcVar18 = pToCol->a[uVar15].zEName;
          uVar7 = 0;
          if (pcVar18 != (char *)0x0) {
            sVar8 = strlen(pcVar18);
            uVar7 = (uint)sVar8 & 0x3fffffff;
          }
          data[uVar15 * 2 + 9] = pcVar17;
          if (1 < pParse->eParseMode) {
            for (pRVar12 = pParse->pRename; pRVar12 != (RenameToken *)0x0; pRVar12 = pRVar12->pNext)
            {
              if ((char *)pRVar12->p == pcVar18) {
                pRVar12->p = pcVar17;
                break;
              }
            }
          }
          memcpy(pcVar17,pcVar18,(ulong)uVar7);
          pcVar18 = pcVar17 + uVar7;
          pcVar17 = pcVar18 + 1;
          *pcVar18 = '\0';
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar11);
      }
      *(undefined1 *)((long)data + 0x2c) = 0;
      *(char *)((long)data + 0x2d) = (char)flags;
      *(char *)((long)data + 0x2e) = (char)((uint)flags >> 8);
      ppcVar10 = (char **)sqlite3HashInsert(&pTVar6->pSchema->fkeyHash,data[2],data);
      if (ppcVar10 == data) {
        sqlite3OomFault(db);
        goto LAB_00174dad;
      }
      if (ppcVar10 != (char **)0x0) {
        data[3] = (char *)ppcVar10;
        ppcVar10[4] = (char *)data;
      }
      (pTVar6->u).vtab.azArg = data;
    }
    else {
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
    }
  }
  data = (char **)0x0;
LAB_00174dad:
  if (data != (char **)0x0) {
    sqlite3DbFreeNN(db,data);
  }
  if (pFromCol != (ExprList *)0x0) {
    exprListDeleteNN(db,pFromCol);
  }
  if (pToCol == (ExprList *)0x0) {
    return;
  }
  exprListDeleteNN(db,pToCol);
  return;
LAB_00174fc6:
  if (bVar2 == bVar3) goto LAB_00174fdc;
  lVar9 = lVar9 + 1;
  bVar13 = lVar9 < lVar14;
  if (lVar9 == lVar14) goto LAB_001750c0;
  goto LAB_00174f93;
LAB_00174fdc:
  *(int *)(ppcVar1 + uVar15 * 2) = (int)lVar9;
  if (!bVar13) {
LAB_001750c0:
    sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                    pFromCol->a[uVar15 & 0xffffffff].zEName);
    goto LAB_00174dad;
  }
  if ((1 < pParse->eParseMode) && (pRVar12 = pParse->pRename, pRVar12 != (RenameToken *)0x0)) {
    do {
      if ((char *)pRVar12->p == pFromCol->a[uVar15].zEName) {
        pRVar12->p = ppcVar1 + uVar15 * 2;
        break;
      }
      pRVar12 = pRVar12->pNext;
    } while (pRVar12 != (RenameToken *)0x0);
  }
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar11) goto LAB_00175103;
  goto LAB_00174f66;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  i64 nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zCnName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zEName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  assert( IsOrdinaryTable(p) );
  pFKey->pNextFrom = p->u.tab.pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zCnName, pFromCol->a[i].zEName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse,
          "unknown column \"%s\" in foreign key definition",
          pFromCol->a[i].zEName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zEName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zEName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zEName);
      }
      memcpy(z, pToCol->a[i].zEName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash,
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  assert( IsOrdinaryTable(p) );
  p->u.tab.pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}